

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O1

string * __thiscall
cmMakefileTargetGenerator::CreateResponseFile
          (string *__return_storage_ptr__,cmMakefileTargetGenerator *this,string *name,
          string *options,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makefile_depends)

{
  cmMakefile *this_00;
  bool bVar1;
  Encoding encoding;
  ostream *poVar2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string responseFileNameFull;
  cmGeneratedFileStream responseStream;
  string local_338;
  string local_318;
  basic_string_view<char,_std::char_traits<char>_> local_2f8;
  char local_2e8 [8];
  undefined1 *local_2e0;
  size_type local_2d8;
  pointer local_2d0;
  undefined8 local_2c8;
  undefined1 *local_2c0;
  undefined1 local_2b8 [32];
  undefined1 local_298 [16];
  undefined8 local_288;
  char *local_280;
  size_type local_278;
  pointer local_270;
  
  encoding = (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
               _vptr_cmGlobalGenerator[5])();
  if (encoding == UTF8_WITH_BOM) {
    this_00 = (this->super_cmCommonTargetGenerator).Makefile;
    local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"MSVC","");
    bVar1 = cmMakefile::IsOn(this_00,&local_338);
    bVar1 = !bVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != &local_338.field_2) {
      operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar1 = false;
  }
  if (bVar1) {
    encoding = UTF8;
  }
  local_298._8_8_ = (this->TargetBuildDirectoryFull)._M_dataplus._M_p;
  local_298._0_8_ = (this->TargetBuildDirectoryFull)._M_string_length;
  local_2f8._M_str = local_2e8;
  local_2f8._M_len = 1;
  local_2e8[0] = 0x2f;
  local_288 = 1;
  local_270 = (name->_M_dataplus)._M_p;
  local_278 = name->_M_string_length;
  views._M_len = 3;
  views._M_array = (iterator)local_298;
  local_280 = local_2f8._M_str;
  cmCatViews_abi_cxx11_(&local_318,views);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_298,&local_318,false,encoding);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_298,true);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_298,(options->_M_dataplus)._M_p,options->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)makefile_depends,
             &local_318);
  local_2f8._M_str = (this->TargetBuildDirectory)._M_dataplus._M_p;
  local_2f8._M_len = (this->TargetBuildDirectory)._M_string_length;
  local_2e0 = local_2b8;
  local_2c8 = 1;
  local_2b8[0] = 0x2f;
  local_2e8[0] = '\x01';
  local_2e8[1] = '\0';
  local_2e8[2] = '\0';
  local_2e8[3] = '\0';
  local_2e8[4] = '\0';
  local_2e8[5] = '\0';
  local_2e8[6] = '\0';
  local_2e8[7] = '\0';
  local_2d0 = (name->_M_dataplus)._M_p;
  local_2d8 = name->_M_string_length;
  views_00._M_len = 3;
  views_00._M_array = &local_2f8;
  local_2c0 = local_2e0;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views_00);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefileTargetGenerator::CreateResponseFile(
  const std::string& name, std::string const& options,
  std::vector<std::string>& makefile_depends)
{
  // FIXME: Find a better way to determine the response file encoding,
  // perhaps using tool-specific platform information variables.
  // For now, use the makefile encoding as a heuristic.
  codecvt::Encoding responseEncoding =
    this->GlobalGenerator->GetMakefileEncoding();
  // Non-MSVC tooling may not understand a BOM.
  if (responseEncoding == codecvt::UTF8_WITH_BOM &&
      !this->Makefile->IsOn("MSVC")) {
    responseEncoding = codecvt::UTF8;
  }

  // Create the response file.
  std::string responseFileNameFull =
    cmStrCat(this->TargetBuildDirectoryFull, '/', name);
  cmGeneratedFileStream responseStream(responseFileNameFull, false,
                                       responseEncoding);
  responseStream.SetCopyIfDifferent(true);
  responseStream << options << "\n";

  // Add a dependency so the target will rebuild when the set of
  // objects changes.
  makefile_depends.push_back(std::move(responseFileNameFull));

  // Construct the name to be used on the command line.
  std::string responseFileName =
    cmStrCat(this->TargetBuildDirectory, '/', name);
  return responseFileName;
}